

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indirect_value.h
# Opt level: O3

indirect_value<int,_stats,_stats> * __thiscall
isocpp_p1950::indirect_value<int,_stats,_stats>::operator=
          (indirect_value<int,_stats,_stats> *this,indirect_value<int,_stats,_stats> *i)

{
  int *piVar1;
  int *piVar2;
  
  piVar1 = i->ptr_;
  if (piVar1 == (int *)0x0) {
    piVar2 = (int *)0x0;
  }
  else {
    stats::copy_operator_count = stats::copy_operator_count + 1;
    piVar2 = (int *)operator_new(4);
    *piVar2 = *piVar1;
  }
  piVar1 = this->ptr_;
  if (piVar1 != (int *)0x0) {
    this->ptr_ = (int *)0x0;
    operator_delete(piVar1,4);
    stats::delete_operator_count = stats::delete_operator_count + 1;
  }
  stats::copy_assign_count = stats::copy_assign_count + 2;
  this->ptr_ = piVar2;
  return this;
}

Assistant:

constexpr indirect_value& operator=(const indirect_value& i) {
    // When copying T throws, *this will remain unchanged.
    // When assigning copy_base or delete_base throws,
    // ptr_ will be null.
    auto temp_guard = i.make_guarded_copy();
    reset();
    copy_base::operator=(i);
    delete_base::operator=(i);
    ptr_ = temp_guard.release();
    return *this;
  }